

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::
write_decimal<long_long>
          (arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this,
          longlong value)

{
  buffer<char> *pbVar1;
  size_t sVar2;
  bool bVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  char *__dest;
  undefined1 *puVar7;
  buffer<char> *c;
  uint uVar8;
  ulong __n;
  ulong uVar9;
  char buffer [40];
  undefined1 auStack_58 [40];
  
  uVar6 = -value;
  if (0 < value) {
    uVar6 = value;
  }
  lVar4 = 0x3f;
  if ((uVar6 | 1) != 0) {
    for (; (uVar6 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  uVar8 = ((uint)lVar4 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar8 = (uVar8 - (uVar6 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 + (ulong)uVar8 * 8)
                   )) + 1;
  __n = (ulong)uVar8;
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar9 = (sVar2 - (value >> 0x3f)) + __n;
  if (pbVar1->capacity_ < uVar9) {
    (**pbVar1->_vptr_buffer)(pbVar1,uVar9);
  }
  __dest = pbVar1->ptr_ + sVar2;
  pbVar1->size_ = uVar9;
  if (value < 0) {
    *__dest = '-';
    __dest = __dest + 1;
  }
  puVar7 = auStack_58 + __n;
  uVar9 = uVar6;
  if (99 < uVar6) {
    do {
      uVar6 = uVar9 / 100;
      *(undefined2 *)(puVar7 + -2) =
           *(undefined2 *)
            (basic_data<void>::digits + (ulong)(uint)((int)uVar9 + (int)uVar6 * -100) * 2);
      puVar7 = puVar7 + -2;
      bVar3 = 9999 < uVar9;
      uVar9 = uVar6;
    } while (bVar3);
  }
  if (uVar6 < 10) {
    bVar5 = (byte)uVar6 | 0x30;
    lVar4 = -1;
  }
  else {
    puVar7[-1] = basic_data<void>::digits[(uVar6 * 2 & 0xffffffff) + 1];
    bVar5 = basic_data<void>::digits[uVar6 * 2 & 0x1fffffffe];
    lVar4 = -2;
  }
  puVar7[lVar4] = bVar5;
  if (uVar8 != 0) {
    memcpy(__dest,auStack_58,__n);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }